

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_prediction_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5564d0::
DrPredTest<unsigned_char,_void_(*)(unsigned_char_*,_long,_int,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int)>
::RundrPredTest(DrPredTest<unsigned_char,_void_(*)(unsigned_char_*,_long,_int,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int)>
                *this,int speed)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint angle;
  int i;
  long lVar5;
  int *piVar6;
  
  if ((this->params_).tst_fn !=
      (_func_void_uchar_ptr_long_int_int_uchar_ptr_uchar_ptr_int_int_int_int_int *)0x0) {
    iVar4 = this->start_angle_;
    iVar1 = this->stop_angle_;
    if (speed != 0) {
      iVar4 = 0;
      iVar1 = 3;
    }
    iVar2 = 0;
    while (this->enable_upsample_ = iVar2, lVar5 = (long)iVar4, piVar6 = &DAT_00aa112c + iVar4,
          iVar2 < 2) {
      for (; lVar5 < iVar1; lVar5 = lVar5 + 1) {
        if (speed == 0) {
          angle = (uint)lVar5;
        }
        else {
          angle = this->start_angle_ + *piVar6;
        }
        iVar2 = av1_get_dx(angle);
        this->dx_ = iVar2;
        iVar3 = av1_get_dy(angle);
        this->dy_ = iVar3;
        if (speed != 0) {
          printf("enable_upsample: %d angle: %d ~~~~~~~~~~~~~~~\n",
                 (ulong)(uint)this->enable_upsample_,(ulong)angle);
          iVar2 = this->dx_;
          iVar3 = this->dy_;
        }
        if ((iVar2 != 0) && (iVar3 != 0)) {
          RunTest(this,speed != 0,false,angle);
        }
        piVar6 = piVar6 + 1;
      }
      iVar2 = this->enable_upsample_ + 1;
    }
  }
  return;
}

Assistant:

void RundrPredTest(const int speed) {
    if (params_.tst_fn == nullptr) return;
    const int angles[] = { 3, 45, 87 };
    const int start_angle = speed ? 0 : start_angle_;
    const int stop_angle = speed ? 3 : stop_angle_;
    for (enable_upsample_ = 0; enable_upsample_ < 2; ++enable_upsample_) {
      for (int i = start_angle; i < stop_angle; ++i) {
        const int angle = speed ? angles[i] + start_angle_ : i;
        dx_ = av1_get_dx(angle);
        dy_ = av1_get_dy(angle);
        if (speed) {
          printf("enable_upsample: %d angle: %d ~~~~~~~~~~~~~~~\n",
                 enable_upsample_, angle);
        }
        if (dx_ && dy_) RunTest(speed, false, angle);
      }
    }
  }